

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsalo(prscxdef *ctx,int subnodes)

{
  int iVar1;
  prsndef *ppVar2;
  int in_ESI;
  uint siz;
  uint in_stack_ffffffffffffffec;
  
  if (in_ESI == 0) {
    iVar1 = 0x78;
  }
  else {
    iVar1 = in_ESI * 8 + 8;
  }
  ppVar2 = (prsndef *)prsbalo((prscxdef *)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffec);
  return ppVar2;
}

Assistant:

static prsndef *prsalo(prscxdef *ctx, int subnodes)
{
    uint siz;

    /* figure size of node we actually need */
    siz = offsetof(prsndef, prsnv.prsnvt);
    if (subnodes)
        siz += (subnodes * sizeof(prsndef *));
    else
        siz += sizeof(tokdef);
    
    return((prsndef *)prsbalo(ctx, siz));
}